

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope_guard.hpp
# Opt level: O1

void __thiscall
scope_guard::detail::
scope_guard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/example/scope_exit_example.cpp:72:3),_scope_guard::detail::on_exit_policy>
::~scope_guard(scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]scope_guard_example_scope_exit_example_cpp:72:3),_scope_guard::detail::on_exit_policy>
               *this)

{
  if ((this->policy_).execute_ == true) {
    std::fstream::close();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[2] close file",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
  }
  return;
}

Assistant:

NEARGYE_NOEXCEPT(is_nothrow_invocable_action<A>::value) {
    if (policy_.should_execute()) {
      NEARGYE_TRY
        action_();
      NEARGYE_CATCH
    }
  }